

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O2

void __thiscall OpenMD::Morse::calcForce(Morse *this,InteractionData *idat)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector<double,_3U> local_50;
  Vector<double,_3U> local_38;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar2[idat->atid1]].
                    super__Vector_base<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar4 = (long)piVar2[idat->atid2] * 0x20;
  dVar12 = *(double *)(lVar3 + lVar4);
  dVar6 = *(double *)(lVar3 + 8 + lVar4);
  dVar11 = *(double *)(lVar3 + 0x10 + lVar4);
  iVar1 = *(int *)(lVar3 + 0x18 + lVar4);
  dVar5 = exp((idat->rij - dVar6) * -dVar11);
  if (idat->shiftedPot == false) {
    dVar7 = 0.0;
    dVar10 = 0.0;
    if (idat->shiftedForce == true) goto LAB_001db58b;
  }
  else {
LAB_001db58b:
    dVar7 = exp((idat->rcut - dVar6) * -dVar11);
    dVar10 = dVar7 * dVar7;
  }
  dVar6 = dVar5 * dVar5;
  dVar8 = 0.0;
  if (iVar1 == 1) {
    dVar9 = dVar12 * dVar6;
    dVar11 = dVar12 * -2.0 * dVar11;
    dVar6 = dVar6 * dVar11;
    if (idat->shiftedPot != true) {
      if (idat->shiftedForce == true) {
        dVar8 = dVar11 * dVar10;
        dVar12 = dVar12 * dVar10 + (idat->rij - idat->rcut) * dVar8;
        goto LAB_001db6ad;
      }
LAB_001db6a9:
      dVar12 = 0.0;
      goto LAB_001db6ad;
    }
  }
  else {
    if (iVar1 != 0) {
      dVar6 = 0.0;
      dVar12 = 0.0;
      dVar9 = 0.0;
      goto LAB_001db6ad;
    }
    dVar9 = (dVar6 - (dVar5 + dVar5)) * dVar12;
    dVar11 = (dVar12 + dVar12) * dVar11;
    dVar6 = (dVar5 - dVar6) * dVar11;
    if (idat->shiftedPot != true) {
      if (idat->shiftedForce == true) {
        dVar8 = dVar11 * (dVar7 - dVar10);
        dVar12 = dVar12 * (dVar10 - (dVar7 + dVar7)) + (idat->rij - idat->rcut) * dVar8;
        goto LAB_001db6ad;
      }
      goto LAB_001db6a9;
    }
    dVar10 = dVar10 - (dVar7 + dVar7);
  }
  dVar12 = dVar12 * dVar10;
LAB_001db6ad:
  dVar11 = idat->sw;
  dVar5 = idat->vdwMult;
  dVar12 = (dVar9 - dVar12) * dVar5;
  dVar7 = dVar11 * dVar12;
  idat->vpair = dVar12 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar7;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar7 + (idat->selePot).data_[1];
  }
  operator*(&local_50,&(idat->d).super_Vector<double,_3U>,(dVar6 - dVar8) * dVar5 * dVar11);
  operator/(&local_38,&local_50,idat->rij);
  Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,&local_38);
  return;
}

Assistant:

void Morse::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MorseInteractionData& mixer =
        MixingMap[Mtids[idat.atid1]][Mtids[idat.atid2]];

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType De       = mixer.De;
    RealType Re       = mixer.Re;
    RealType beta     = mixer.beta;
    MorseType variant = mixer.variant;

    // V(r) = D_e exp(-a(r-re)(exp(-a(r-re))-2)

    RealType expt    = -beta * (idat.rij - Re);
    RealType expfnc  = exp(expt);
    RealType expfnc2 = expfnc * expfnc;

    RealType exptC    = 0.0;
    RealType expfncC  = 0.0;
    RealType expfnc2C = 0.0;

    if (idat.shiftedPot || idat.shiftedForce) {
      exptC    = -beta * (idat.rcut - Re);
      expfncC  = exp(exptC);
      expfnc2C = expfncC * expfncC;
    }

    switch (variant) {
    case mtShifted: {
      myPot   = De * (expfnc2 - 2.0 * expfnc);
      myDeriv = 2.0 * De * beta * (expfnc - expfnc2);

      if (idat.shiftedPot) {
        myPotC   = De * (expfnc2C - 2.0 * expfncC);
        myDerivC = 0.0;
      } else if (idat.shiftedForce) {
        myPotC   = De * (expfnc2C - 2.0 * expfncC);
        myDerivC = 2.0 * De * beta * (expfncC - expfnc2C);
        myPotC += myDerivC * (idat.rij - idat.rcut);
      } else {
        myPotC   = 0.0;
        myDerivC = 0.0;
      }

      break;
    }
    case mtRepulsive: {
      myPot   = De * expfnc2;
      myDeriv = -2.0 * De * beta * expfnc2;

      if (idat.shiftedPot) {
        myPotC   = De * expfnc2C;
        myDerivC = 0.0;
      } else if (idat.shiftedForce) {
        myPotC   = De * expfnc2C;
        myDerivC = -2.0 * De * beta * expfnc2C;
        myPotC += myDerivC * (idat.rij - idat.rcut);
      } else {
        myPotC   = 0.0;
        myDerivC = 0.0;
      }

      break;
    }
    case mtUnknown: {
      // don't know what to do so don't do anything
      break;
    }
    }

    RealType pot_temp = idat.vdwMult * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * (myDeriv - myDerivC);

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }